

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolARP.cpp
# Opt level: O2

ostream * operator<<(ostream *out,ProtocolARP *obj)

{
  ostream *poVar1;
  int iVar2;
  long lVar3;
  ARPCacheEntry *pAVar4;
  string local_1f8;
  string s;
  stringstream ss;
  undefined1 local_1a8 [376];
  
  std::operator<<(out,"ARP Cache (ostream):\n");
  for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(uint)obj->Cache[lVar3].IPv4Address[0]);
    std::operator<<(poVar1,".");
    pAVar4 = obj->Cache + lVar3;
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(uint)pAVar4->IPv4Address[1]);
    std::operator<<(poVar1,".");
    poVar1 = (ostream *)std::ostream::operator<<(local_1a8,(uint)pAVar4->IPv4Address[2]);
    std::operator<<(poVar1,".");
    std::ostream::operator<<(local_1a8,(uint)pAVar4->IPv4Address[3]);
    std::__cxx11::stringbuf::str();
    poVar1 = std::operator<<(out,"   ");
    std::operator<<(poVar1,(string *)&s);
    for (iVar2 = (int)s._M_string_length; iVar2 < 0x13; iVar2 = iVar2 + 1) {
      std::operator<<(out," ");
    }
    to_hex<unsigned_char>(&local_1f8,pAVar4->MACAddress[0],2);
    poVar1 = std::operator<<(out,(string *)&local_1f8);
    std::operator<<(poVar1,":");
    std::__cxx11::string::~string((string *)&local_1f8);
    to_hex<unsigned_char>(&local_1f8,pAVar4->MACAddress[1],2);
    poVar1 = std::operator<<(out,(string *)&local_1f8);
    std::operator<<(poVar1,":");
    std::__cxx11::string::~string((string *)&local_1f8);
    to_hex<unsigned_char>(&local_1f8,pAVar4->MACAddress[2],2);
    poVar1 = std::operator<<(out,(string *)&local_1f8);
    std::operator<<(poVar1,":");
    std::__cxx11::string::~string((string *)&local_1f8);
    to_hex<unsigned_char>(&local_1f8,pAVar4->MACAddress[3],2);
    poVar1 = std::operator<<(out,(string *)&local_1f8);
    std::operator<<(poVar1,":");
    std::__cxx11::string::~string((string *)&local_1f8);
    to_hex<unsigned_char>(&local_1f8,pAVar4->MACAddress[4],2);
    poVar1 = std::operator<<(out,(string *)&local_1f8);
    std::operator<<(poVar1,":");
    std::__cxx11::string::~string((string *)&local_1f8);
    to_hex<unsigned_char>(&local_1f8,pAVar4->MACAddress[5],2);
    std::operator<<(out,(string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    poVar1 = std::operator<<(out,"   age = ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)pAVar4->Age);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::~string((string *)&s);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const ProtocolARP& obj)
{
    out << "ARP Cache (ostream):\n";
    for (int i = 0; i < ARPCacheSize; i++)
    {
        std::stringstream ss;
        ss << (int)obj.Cache[i].IPv4Address[0] << ".";
        ss << (int)obj.Cache[i].IPv4Address[1] << ".";
        ss << (int)obj.Cache[i].IPv4Address[2] << ".";
        ss << (int)obj.Cache[i].IPv4Address[3];
        std::string s = ss.str();

        out << "   " << s;
        for (int length = s.size(); length < 19; length++)
        {
            out << " ";
        }
        out << to_hex(obj.Cache[i].MACAddress[0]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[1]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[2]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[3]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[4]) << ":";
        out << to_hex(obj.Cache[i].MACAddress[5]);
        out << "   age = " << (int)obj.Cache[i].Age << "\n";
    }
    return out;
}